

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall google::protobuf::Message::PrintDebugString(Message *this)

{
  string local_30;
  
  DebugString_abi_cxx11_(&local_30,this);
  printf("%s",local_30._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Message::PrintDebugString() const { printf("%s", DebugString().c_str()); }